

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O2

Expression * __thiscall
soul::BlockBuilder::createComparisonOp(BlockBuilder *this,Expression *lhs,Expression *rhs,Op op)

{
  Expression *pEVar1;
  CodeLocation local_18;
  
  local_18.sourceCode.object = (SourceCodeText *)0x0;
  local_18.location.data = (char *)0x0;
  pEVar1 = createBinaryOp(this,&local_18,lhs,rhs,op);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_18.sourceCode);
  return pEVar1;
}

Assistant:

heart::Expression& createComparisonOp (heart::Expression& lhs, heart::Expression& rhs, BinaryOp::Op op)
    {
        return createBinaryOp ({}, lhs, rhs, op);
    }